

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

void variance16_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m128i *sse,
                    __m128i *sum)

{
  int in_R8D;
  int i;
  undefined4 in_stack_00000020;
  uint8_t *in_stack_00000030;
  uint8_t *in_stack_00000038;
  int local_44;
  
  (*sse)[0] = 0;
  (*sse)[1] = 0;
  for (local_44 = 0; local_44 < in_R8D; local_44 = local_44 + 1) {
    variance16_kernel_sse2
              (in_stack_00000038,in_stack_00000030,(__m128i *)src,
               (__m128i *)CONCAT44(src_stride,in_stack_00000020));
  }
  return;
}

Assistant:

static inline void variance16_sse2(const uint8_t *src, const int src_stride,
                                   const uint8_t *ref, const int ref_stride,
                                   const int h, __m128i *const sse,
                                   __m128i *const sum) {
  assert(h <= 64);  // May overflow for larger height.
  *sum = _mm_setzero_si128();

  for (int i = 0; i < h; ++i) {
    variance16_kernel_sse2(src, ref, sse, sum);
    src += src_stride;
    ref += ref_stride;
  }
}